

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase675::run(TestCase675 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  undefined6 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  Builder local_230;
  bool local_211;
  undefined1 local_210 [7];
  bool _kj_shouldLog_2;
  bool local_1f1;
  undefined1 local_1f0 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1d0;
  size_t local_1c0;
  uint local_1b8;
  bool local_1b1;
  undefined1 auStack_1b0 [7];
  bool _kj_shouldLog;
  size_t local_1a8;
  ArrayPtr<const_char> local_1a0;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_190;
  word *local_180;
  word *zerosEnd;
  CapTableBuilder *pCStack_170;
  void *local_168;
  WirePointer *pWStack_160;
  undefined8 local_158;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_150;
  word *local_140;
  word *zerosStart;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase675 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  local_150 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_150,0);
  local_140 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)&zerosEnd,(Builder *)local_128);
  builder_00._builder.capTable = (CapTableBuilder *)local_168;
  builder_00._builder.segment = (SegmentBuilder *)pCStack_170;
  builder_00._builder.data = pWStack_160;
  builder_00._builder.pointers = (WirePointer *)local_158;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffd50;
  builder_00._builder.pointerCount = (short)((uint6)in_stack_fffffffffffffd50 >> 0x20);
  builder_00._builder._38_1_ = in_stack_fffffffffffffd56;
  builder_00._builder._39_1_ = in_stack_fffffffffffffd57;
  initTestMessage(builder_00);
  local_190 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_190,0);
  local_180 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  Text::Reader::Reader((Reader *)&local_1a0,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_128,(Reader)local_1a0);
  _auStack_1b0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1b0);
  if (sVar3 != 1) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      local_1b8 = 1;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_1d0 = AVar4;
      local_1c0 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_1d0);
      kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2ad,ERROR,
                 "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
                 ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
                 &local_1b8,&local_1c0);
      local_1b1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1f0,(Builder *)local_128);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_1f0);
  bVar1 = allZero(local_140,local_180);
  if (!bVar1) {
    local_1f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f1 != false) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2b1,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
      local_1f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_210,(Builder *)local_128);
  bVar1 = capnp::operator==("foo",(Builder *)local_210);
  if (!bVar1) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_230,(Builder *)local_128);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2b3,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
                 ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
                 (char (*) [4])"foo",&local_230);
      local_211 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, StructsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  initTestMessage(root.initStructField());
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownStructField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}